

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O0

TWords * __thiscall
NJamSpell::TSpellCorrector::Edits2
          (TWords *__return_storage_ptr__,TSpellCorrector *this,TWord *word,bool lastLevel)

{
  wchar_t *pwVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  *puVar5;
  TWord TVar6;
  TWord TVar7;
  TWord TVar8;
  TWord TVar9;
  TWord local_368;
  TWords local_358;
  undefined1 local_340 [8];
  TWord c_3;
  wstring local_310 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_2f0 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_2d0 [8];
  wstring s_3;
  value_type_conflict *ch_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  *__range3_1;
  TWords local_280;
  undefined1 local_268 [8];
  TWord c_2;
  wstring local_238 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_218 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1f8 [8];
  wstring s_2;
  value_type_conflict *ch;
  const_iterator __end3;
  const_iterator __begin3;
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  *__range3;
  TWords local_1a8;
  undefined1 local_190 [8];
  TWord c_1;
  wstring local_160 [32];
  wstring local_140 [32];
  wstring local_120 [8];
  wstring s_1;
  TWord local_100;
  TWords local_f0;
  undefined1 local_d8 [8];
  TWord c;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a8 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_88 [8];
  wstring s;
  ulong local_68;
  size_t i;
  allocator local_49;
  wstring local_48 [8];
  wstring w;
  bool lastLevel_local;
  TWord *word_local;
  TSpellCorrector *this_local;
  TWords *result;
  
  pwVar1 = word->Ptr;
  uVar4 = word->Len;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring(local_48,pwVar1,uVar4,&local_49);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_49);
  std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::vector(__return_storage_ptr__);
  for (local_68 = 0; lVar3 = std::__cxx11::wstring::size(), local_68 < lVar3 + 1U;
      local_68 = local_68 + 1) {
    uVar4 = std::__cxx11::wstring::size();
    if (local_68 < uVar4) {
      std::__cxx11::wstring::substr((ulong)local_a8,(ulong)local_48);
      std::__cxx11::wstring::substr((ulong)&c.Len,(ulong)local_48);
      std::operator+(local_88,local_a8);
      std::__cxx11::wstring::~wstring((wstring *)&c.Len);
      std::__cxx11::wstring::~wstring((wstring *)local_a8);
      TVar6 = TLangModel::GetWord(&this->LangModel,local_88);
      c.Ptr = (wchar_t *)TVar6.Len;
      local_d8 = (undefined1  [8])TVar6.Ptr;
      if ((local_d8 != (undefined1  [8])0x0) && (c.Ptr != (wchar_t *)0x0)) {
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_d8);
        TVar6.Len = (size_t)c.Ptr;
        TVar6.Ptr = (wchar_t *)local_d8;
      }
      c.Ptr = (wchar_t *)TVar6.Len;
      local_d8 = (undefined1  [8])TVar6.Ptr;
      if (!lastLevel) {
        TWord::TWord(&local_100,local_88);
        Edits2(&local_f0,this,&local_100,true);
        AddVec<std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>
                  (__return_storage_ptr__,&local_f0);
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector(&local_f0);
        TVar6.Len = (size_t)c.Ptr;
        TVar6.Ptr = (wchar_t *)local_d8;
      }
      c.Ptr = (wchar_t *)TVar6.Len;
      local_d8 = (undefined1  [8])TVar6.Ptr;
      std::__cxx11::wstring::~wstring((wstring *)local_88);
    }
    uVar4 = std::__cxx11::wstring::size();
    if (local_68 + 1 < uVar4) {
      std::__cxx11::wstring::substr((ulong)local_120,(ulong)local_48);
      std::__cxx11::wstring::substr((ulong)local_140,(ulong)local_48);
      std::__cxx11::wstring::operator+=(local_120,local_140);
      std::__cxx11::wstring::~wstring(local_140);
      std::__cxx11::wstring::substr((ulong)local_160,(ulong)local_48);
      std::__cxx11::wstring::operator+=(local_120,local_160);
      std::__cxx11::wstring::~wstring(local_160);
      uVar4 = std::__cxx11::wstring::size();
      if (local_68 + 2 < uVar4) {
        std::__cxx11::wstring::substr((ulong)&c_1.Len,(ulong)local_48);
        std::__cxx11::wstring::operator+=(local_120,(wstring *)&c_1.Len);
        std::__cxx11::wstring::~wstring((wstring *)&c_1.Len);
      }
      TVar7 = TLangModel::GetWord(&this->LangModel,(wstring *)local_120);
      c_1.Ptr = (wchar_t *)TVar7.Len;
      local_190 = (undefined1  [8])TVar7.Ptr;
      if ((local_190 != (undefined1  [8])0x0) && (c_1.Ptr != (wchar_t *)0x0)) {
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_190);
        TVar7.Len = (size_t)c_1.Ptr;
        TVar7.Ptr = (wchar_t *)local_190;
      }
      c_1.Ptr = (wchar_t *)TVar7.Len;
      local_190 = (undefined1  [8])TVar7.Ptr;
      if (!lastLevel) {
        TWord::TWord((TWord *)&__range3,(wstring *)local_120);
        Edits2(&local_1a8,this,(TWord *)&__range3,true);
        AddVec<std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>
                  (__return_storage_ptr__,&local_1a8);
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector(&local_1a8);
        TVar7.Len = (size_t)c_1.Ptr;
        TVar7.Ptr = (wchar_t *)local_190;
      }
      c_1.Ptr = (wchar_t *)TVar7.Len;
      local_190 = (undefined1  [8])TVar7.Ptr;
      std::__cxx11::wstring::~wstring(local_120);
    }
    uVar4 = std::__cxx11::wstring::size();
    if (local_68 < uVar4) {
      puVar5 = TLangModel::GetAlphabet(&this->LangModel);
      __end3 = std::
               unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
               ::begin(puVar5);
      ch = (value_type_conflict *)
           std::
           unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
           ::end(puVar5);
      while (bVar2 = std::__detail::operator!=
                               (&__end3.super__Node_iterator_base<wchar_t,_false>,
                                (_Node_iterator_base<wchar_t,_false> *)&ch), bVar2) {
        std::__detail::_Node_const_iterator<wchar_t,_true,_false>::operator*(&__end3);
        std::__cxx11::wstring::substr((ulong)local_238,(ulong)local_48);
        std::operator+(local_218,(wchar_t)local_238);
        std::__cxx11::wstring::substr((ulong)&c_2.Len,(ulong)local_48);
        std::operator+(local_1f8,local_218);
        std::__cxx11::wstring::~wstring((wstring *)&c_2.Len);
        std::__cxx11::wstring::~wstring((wstring *)local_218);
        std::__cxx11::wstring::~wstring(local_238);
        TVar8 = TLangModel::GetWord(&this->LangModel,local_1f8);
        c_2.Ptr = (wchar_t *)TVar8.Len;
        local_268 = (undefined1  [8])TVar8.Ptr;
        if ((local_268 != (undefined1  [8])0x0) && (c_2.Ptr != (wchar_t *)0x0)) {
          std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                    (__return_storage_ptr__,(value_type *)local_268);
          TVar8.Len = (size_t)c_2.Ptr;
          TVar8.Ptr = (wchar_t *)local_268;
        }
        c_2.Ptr = (wchar_t *)TVar8.Len;
        local_268 = (undefined1  [8])TVar8.Ptr;
        if (!lastLevel) {
          TWord::TWord((TWord *)&__range3_1,local_1f8);
          Edits2(&local_280,this,(TWord *)&__range3_1,true);
          AddVec<std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>
                    (__return_storage_ptr__,&local_280);
          std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector(&local_280);
          TVar8.Len = (size_t)c_2.Ptr;
          TVar8.Ptr = (wchar_t *)local_268;
        }
        c_2.Ptr = (wchar_t *)TVar8.Len;
        local_268 = (undefined1  [8])TVar8.Ptr;
        std::__cxx11::wstring::~wstring((wstring *)local_1f8);
        std::__detail::_Node_const_iterator<wchar_t,_true,_false>::operator++(&__end3);
      }
    }
    puVar5 = TLangModel::GetAlphabet(&this->LangModel);
    __end3_1 = std::
               unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
               ::begin(puVar5);
    ch_1 = (value_type_conflict *)
           std::
           unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
           ::end(puVar5);
    while (bVar2 = std::__detail::operator!=
                             (&__end3_1.super__Node_iterator_base<wchar_t,_false>,
                              (_Node_iterator_base<wchar_t,_false> *)&ch_1), bVar2) {
      std::__detail::_Node_const_iterator<wchar_t,_true,_false>::operator*(&__end3_1);
      std::__cxx11::wstring::substr((ulong)local_310,(ulong)local_48);
      std::operator+(local_2f0,(wchar_t)local_310);
      std::__cxx11::wstring::substr((ulong)&c_3.Len,(ulong)local_48);
      std::operator+(local_2d0,local_2f0);
      std::__cxx11::wstring::~wstring((wstring *)&c_3.Len);
      std::__cxx11::wstring::~wstring((wstring *)local_2f0);
      std::__cxx11::wstring::~wstring(local_310);
      TVar9 = TLangModel::GetWord(&this->LangModel,local_2d0);
      c_3.Ptr = (wchar_t *)TVar9.Len;
      local_340 = (undefined1  [8])TVar9.Ptr;
      if ((local_340 != (undefined1  [8])0x0) && (c_3.Ptr != (wchar_t *)0x0)) {
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_340);
        TVar9.Len = (size_t)c_3.Ptr;
        TVar9.Ptr = (wchar_t *)local_340;
      }
      c_3.Ptr = (wchar_t *)TVar9.Len;
      local_340 = (undefined1  [8])TVar9.Ptr;
      if (!lastLevel) {
        TWord::TWord(&local_368,local_2d0);
        Edits2(&local_358,this,&local_368,true);
        AddVec<std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>
                  (__return_storage_ptr__,&local_358);
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector(&local_358);
        TVar9.Len = (size_t)c_3.Ptr;
        TVar9.Ptr = (wchar_t *)local_340;
      }
      c_3.Ptr = (wchar_t *)TVar9.Len;
      local_340 = (undefined1  [8])TVar9.Ptr;
      std::__cxx11::wstring::~wstring((wstring *)local_2d0);
      std::__detail::_Node_const_iterator<wchar_t,_true,_false>::operator++(&__end3_1);
    }
  }
  std::__cxx11::wstring::~wstring(local_48);
  return __return_storage_ptr__;
}

Assistant:

TWords TSpellCorrector::Edits2(const TWord& word, bool lastLevel) const {
    std::wstring w(word.Ptr, word.Len);
    TWords result;

    for (size_t i = 0; i < w.size() + 1; ++i) {
        // delete
        if (i < w.size()) {
            std::wstring s = w.substr(0, i) + w.substr(i+1);
            TWord c = LangModel.GetWord(s);
            if (c.Ptr && c.Len) {
                result.push_back(c);
            }
            if (!lastLevel) {
                AddVec(result, Edits2(TWord(s)));
            }
        }

        // transpose
        if (i + 1 < w.size()) {
            std::wstring s = w.substr(0, i);
            s += w.substr(i + 1, 1);
            s += w.substr(i, 1);
            if (i + 2 < w.size()) {
                s += w.substr(i+2);
            }
            TWord c = LangModel.GetWord(s);
            if (c.Ptr && c.Len) {
                result.push_back(c);
            }
            if (!lastLevel) {
                AddVec(result, Edits2(TWord(s)));
            }
        }

        // replace
        if (i < w.size()) {
            for (auto&& ch: LangModel.GetAlphabet()) {
                std::wstring s = w.substr(0, i) + ch + w.substr(i+1);
                TWord c = LangModel.GetWord(s);
                if (c.Ptr && c.Len) {
                    result.push_back(c);
                }
                if (!lastLevel) {
                    AddVec(result, Edits2(TWord(s)));
                }
            }
        }

        // inserts
        {
            for (auto&& ch: LangModel.GetAlphabet()) {
                std::wstring s = w.substr(0, i) + ch + w.substr(i);
                TWord c = LangModel.GetWord(s);
                if (c.Ptr && c.Len) {
                    result.push_back(c);
                }
                if (!lastLevel) {
                    AddVec(result, Edits2(TWord(s)));
                }
            }
        }
    }

    return result;
}